

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void fprint_vector_stats(FILE *file,vector<unsigned_long,_std::allocator<unsigned_long>_> *vec,
                        char *hdr,bool do_json)

{
  unsigned_long uVar1;
  size_type sVar2;
  reference puVar3;
  long lVar4;
  size_type sVar5;
  byte in_CL;
  undefined8 in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  FILE *in_RDI;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 uVar9;
  undefined4 uVar16;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  size_t i;
  long max;
  long ninetyseven5;
  long two5;
  long min;
  double median;
  double mean;
  double var;
  double sum;
  double local_d8;
  ulong local_68;
  unsigned_long local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  unsigned_long local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  undefined1 auVar12 [16];
  
  local_28 = 0.0;
  local_30 = 0.0;
  local_38 = 0.0;
  local_40 = 0.0;
  local_48 = 0;
  local_50 = 0;
  local_58 = 0;
  local_60 = 0;
  local_68 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
    if (sVar2 <= local_68) break;
    puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,local_68)
    ;
    uVar1 = *puVar3;
    auVar10._8_4_ = (int)(uVar1 >> 0x20);
    auVar10._0_8_ = uVar1;
    auVar10._12_4_ = 0x45300000;
    local_28 = local_28 +
               (auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,local_68)
    ;
    uVar1 = *puVar3;
    puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,local_68)
    ;
    lVar4 = uVar1 * *puVar3;
    auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar7._0_8_ = lVar4;
    auVar7._12_4_ = 0x45300000;
    local_30 = (auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0) + local_30;
    local_68 = local_68 + 1;
  }
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
  if (sVar2 != 0) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
    auVar17._8_4_ = (int)(sVar2 >> 0x20);
    auVar17._0_8_ = sVar2;
    auVar17._12_4_ = 0x45300000;
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
    lVar4 = sVar5 - 1;
    auVar11._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar11._0_8_ = lVar4;
    auVar11._12_4_ = 0x45300000;
    local_30 = (local_30 -
               (local_28 * local_28) /
               ((auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0))) /
               ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
    uVar16 = (undefined4)(local_68 >> 0x20);
    auVar12._8_4_ = uVar16;
    auVar12._0_8_ = local_68;
    auVar12._12_4_ = 0x45300000;
    uVar9 = (undefined4)local_68;
    local_38 = local_28 /
               ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar9) - 4503599627370496.0));
    if ((local_68 & 1) == 0) {
      puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RSI,local_68 >> 1);
      uVar1 = *puVar3;
      puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RSI,(local_68 >> 1) - 1);
      lVar4 = uVar1 + *puVar3;
      auVar14._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar14._0_8_ = lVar4;
      auVar14._12_4_ = 0x45300000;
      local_d8 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * 0.5;
    }
    else {
      puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RSI,local_68 >> 1);
      uVar1 = *puVar3;
      auVar13._8_4_ = (int)(uVar1 >> 0x20);
      auVar13._0_8_ = uVar1;
      auVar13._12_4_ = 0x45300000;
      local_d8 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.0;
    }
    local_40 = local_d8;
    puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,0);
    local_48 = *puVar3;
    auVar8._8_4_ = uVar16;
    auVar8._0_8_ = local_68;
    auVar8._12_4_ = 0x45300000;
    puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RSI,(long)(((auVar8._8_8_ - 1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,uVar9) - 4503599627370496.0)) *
                                     0.025));
    local_50 = *puVar3;
    auVar15._8_4_ = uVar16;
    auVar15._0_8_ = local_68;
    auVar15._12_4_ = 0x45300000;
    puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RSI,(long)(((auVar15._8_8_ - 1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,uVar9) - 4503599627370496.0)) *
                                     0.975));
    local_58 = *puVar3;
    puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RSI,local_68 - 1);
    local_60 = *puVar3;
  }
  if ((in_CL & 1) == 0) {
    dVar6 = sqrt(local_30);
    fprintf(in_RDI,
            "\n%s\n    mean:                %g\n    median:              %g\n    variance             %g\n    standard deviation:  %g\n    min:                 %ld\n    2.5%%:                %ld\n    97.5%%:               %ld\n    max:                 %ld\n"
            ,local_38,local_40,local_30,SUB84(dVar6,0),in_RDX,local_48,local_50,local_58,local_60);
  }
  else {
    dVar6 = sqrt(local_30);
    fprintf(in_RDI,
            ",\n\t\"%s\": {\n\t\t\"mean\":                %g,\n\t\t\"median\":              %g,\n\t\t\"variance\":            %g,\n\t\t\"standard deviation\":  %g,\n\t\t\"min\":                 %ld,\n\t\t\"2.5%%\":                %ld,\n\t\t\"97.5%%\":               %ld,\n\t\t\"max\":                 %ld}"
            ,local_38,local_40,local_30,SUB84(dVar6,0),in_RDX,local_48,local_50,local_58,local_60);
  }
  return;
}

Assistant:

void fprint_vector_stats( FILE * file, std::vector<size_t> & vec, const char * hdr, bool do_json )
{
    double sum = 0.,
           var = 0.,
           mean = 0.,
           median = 0.;
           
    long min = 0,
         two5 = 0,
         ninetyseven5 = 0,
         max = 0;
         
    size_t i;

    for ( i = 0; i < vec.size(); ++i ) {
        sum += vec[i];
        var += vec[i] * vec[i];
    }

    // remember, i == vec.size()

    if ( vec.size() ) {
        var = ( var - ( sum * sum ) / vec.size() ) / ( vec.size() - 1 );
        mean = sum / i;
        median = ( i % 2 ) ? 1.0 * vec[i / 2] : 0.5 * ( vec[i / 2] + vec[i / 2 - 1] );
        min = vec[0];
        two5 = vec[long( 0.025 * i )];
        ninetyseven5 = vec[long( 0.975 * i )];
        max = vec[i - 1];
    }

    if (do_json) {
        fprintf( file, ",\n\t\"%s\": {"
                 "\n\t\t\"mean\":                %g,"
                 "\n\t\t\"median\":              %g,"
                 "\n\t\t\"variance\":            %g,"
                 "\n\t\t\"standard deviation\":  %g,"
                 "\n\t\t\"min\":                 %ld,"
                 "\n\t\t\"2.5%%\":                %ld,"
                 "\n\t\t\"97.5%%\":               %ld,"
                 "\n\t\t\"max\":                 %ld}",
                 hdr,
                 mean,
                 median,
                 var,
                 sqrt( var ),
                 min,
                 two5,
                 ninetyseven5,
                 max
                );
   }
    else {
        fprintf( file, "\n%s\n"
                 "    mean:                %g\n"
                 "    median:              %g\n"
                 "    variance             %g\n"
                 "    standard deviation:  %g\n"
                 "    min:                 %ld\n"
                 "    2.5%%:                %ld\n"
                 "    97.5%%:               %ld\n"
                 "    max:                 %ld\n",
                 hdr,
                 mean,
                 median,
                 var,
                 sqrt( var ),
                 min,
                 two5,
                 ninetyseven5,
                 max
               );
        }
}